

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CBlockHeaderAndShortTxIDs&>
          (PeerManagerImpl *this,CNode *node,string *msg_type,CBlockHeaderAndShortTxIDs *args)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_FS_OFFSET;
  CSerializedNetMsg *in_stack_00000010;
  CNode *in_stack_00000018;
  CConnman *in_stack_00000020;
  CSerializedNetMsg *in_stack_ffffffffffffff48;
  CBlockHeaderAndShortTxIDs *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RDX,in_RCX);
  NetMsg::Make<CBlockHeaderAndShortTxIDs&>(in_RCX,in_stack_ffffffffffffff78);
  CConnman::PushMessage(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  CSerializedNetMsg::~CSerializedNetMsg(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeAndPushMessage(CNode& node, std::string msg_type, Args&&... args) const
    {
        m_connman.PushMessage(&node, NetMsg::Make(std::move(msg_type), std::forward<Args>(args)...));
    }